

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkfile_p.cpp
# Opt level: O0

int __thiscall QNetworkFile::qt_metacall(QNetworkFile *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  QObject *in_stack_00000020;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QFile::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 5) {
        qt_static_metacall(in_stack_00000020,this._4_4_,(int)this,(void **)CONCAT44(_c,_id));
      }
      local_18 = local_18 + -5;
    }
    if (in_ESI == 7) {
      if (local_18 < 5) {
        qt_static_metacall(in_stack_00000020,this._4_4_,(int)this,(void **)CONCAT44(_c,_id));
      }
      local_18 = local_18 + -5;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QNetworkFile::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QFile::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    return _id;
}